

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_threadpool_params_init(ggml_threadpool_params *p,int n_threads)

{
  p->n_threads = n_threads;
  p->prio = GGML_SCHED_PRIO_NORMAL;
  p->poll = 0x32;
  p->strict_cpu = false;
  p->paused = false;
  memset(p,0,0x200);
  return;
}

Assistant:

void ggml_threadpool_params_init(struct ggml_threadpool_params * p, int n_threads) {
    p->n_threads  = n_threads;
    p->prio       = 0;     // default priority (usually means normal or inherited)
    p->poll       = 50;    // hybrid-polling enabled
    p->strict_cpu = false; // no strict placement (all threads share same cpumask)
    p->paused     = false; // threads are ready to go
    memset(p->cpumask, 0, GGML_MAX_N_THREADS); // all-zero means use the default affinity (usually inherited)
}